

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

_Bool upb_Map_Next(upb_Map *map,upb_MessageValue *key,upb_MessageValue *val,size_t *iter)

{
  uintptr_t local_50;
  uintptr_t intkey;
  upb_StringView strkey;
  upb_value uStack_30;
  _Bool ret;
  upb_value v;
  size_t *iter_local;
  upb_MessageValue *val_local;
  upb_MessageValue *key_local;
  upb_Map *map_local;
  
  v.val = (uint64_t)iter;
  if ((map->is_strtable_dont_copy_me__upb_internal_use_only & 1U) == 0) {
    strkey.size._7_1_ =
         upb_inttable_next(&(map->t).inttable,&local_50,&stack0xffffffffffffffd0,(intptr_t *)iter);
    if ((bool)strkey.size._7_1_) {
      memcpy(key,&local_50,(long)map->key_size);
    }
  }
  else {
    strkey.size._7_1_ =
         upb_strtable_next2(&(map->t).strtable,(upb_StringView *)&intkey,&stack0xffffffffffffffd0,
                            (intptr_t *)iter);
    if ((bool)strkey.size._7_1_) {
      _upb_map_fromkey(_intkey,key,(long)map->key_size);
    }
  }
  if ((strkey.size._7_1_ & 1) != 0) {
    _upb_map_fromvalue(uStack_30,val,(long)map->val_size);
  }
  return (_Bool)(strkey.size._7_1_ & 1);
}

Assistant:

bool upb_Map_Next(const upb_Map* map, upb_MessageValue* key,
                  upb_MessageValue* val, size_t* iter) {
  upb_value v;
  bool ret;
  if (map->UPB_PRIVATE(is_strtable)) {
    upb_StringView strkey;
    ret = upb_strtable_next2(&map->t.strtable, &strkey, &v, (intptr_t*)iter);
    if (ret) {
      _upb_map_fromkey(strkey, key, map->key_size);
    }
  } else {
    uintptr_t intkey;
    ret = upb_inttable_next(&map->t.inttable, &intkey, &v, (intptr_t*)iter);
    if (ret) {
      memcpy(key, &intkey, map->key_size);
    }
  }
  if (ret) {
    _upb_map_fromvalue(v, val, map->val_size);
  }
  return ret;
}